

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

StrMap * jsonnet::internal::jsonnet_vm_execute_multi
                   (StrMap *__return_storage_ptr__,Allocator *alloc,AST *ast,ExtMap *ext_vars,
                   uint max_stack,double gc_min_objects,double gc_growth_trigger,
                   VmNativeCallbackMap *natives,JsonnetImportCallback *import_callback,void *ctx,
                   bool string_output)

{
  _Rb_tree_header *p_Var1;
  key_type *__k;
  anon_union_8_3_4e909c26_for_v this;
  mapped_type *ppIVar2;
  _Base_ptr p_Var3;
  AST *ast_;
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  RuntimeError *__return_storage_ptr___00;
  Type t;
  LocationRange loc;
  map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
  fields;
  Interpreter vm;
  undefined1 local_470 [16];
  _Rb_tree_node_base local_460;
  UString local_440;
  anon_union_8_3_4e909c26_for_v local_420;
  string local_418;
  string local_3f8;
  LocationRange local_3d8;
  undefined1 local_398 [8];
  undefined1 local_390 [8];
  _Base_ptr local_388;
  _Rb_tree_node_base *local_380;
  _Rb_tree_node_base *local_378;
  size_t local_370;
  Interpreter local_210;
  
  anon_unknown_0::Interpreter::Interpreter
            (&local_210,alloc,ext_vars,max_stack,gc_min_objects,gc_growth_trigger,natives,
             import_callback,ctx);
  anon_unknown_0::Interpreter::evaluate(&local_210,ast,0);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_470._0_8_ = (_Rb_tree_node_base *)0x14;
  local_398 = (undefined1  [8])&local_388;
  local_398 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_398,(ulong)local_470);
  local_388 = (_Base_ptr)local_470._0_8_;
  *(undefined4 *)local_398 = 0x69727544;
  builtin_strncpy((char *)((long)local_398 + 4),"ng m",4);
  *(undefined4 *)((long)local_398 + 8) = 0x66696e61;
  builtin_strncpy((char *)((long)local_398 + 0xc),"esta",4);
  *(undefined4 *)((long)local_398 + 0x10) = 0x6e6f6974;
  local_390 = (undefined1  [8])local_470._0_8_;
  *(char *)((long)local_398 + local_470._0_8_) = '\0';
  local_3d8.file._M_dataplus._M_p = (pointer)&local_3d8.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d8,local_398,(char *)(local_470._0_8_ + (long)local_398));
  local_3d8.end.line = 0;
  local_3d8.end.column = 0;
  local_3d8.begin.line = 0;
  local_3d8.begin.column = 0;
  if (local_398 != (undefined1  [8])&local_388) {
    operator_delete((void *)local_398,(ulong)((long)&local_388->_M_color + 1));
  }
  this = local_210.scratch.v;
  if (local_210.scratch.t != OBJECT) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_398);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_388,"multi mode: top-level object was a ",0x23);
    (anonymous_namespace)::type_str_abi_cxx11_
              ((string *)local_470,(_anonymous_namespace_ *)(local_210.scratch._0_8_ & 0xffffffff),t
              );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_388,(char *)local_470._0_8_,local_470._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"should be an object whose keys are filenames and values hold ",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"the JSON for that file.",0x17);
    if ((_Rb_tree_node_base *)local_470._0_8_ != &local_460) {
      operator_delete((void *)local_470._0_8_,(ulong)(local_460._0_8_ + 1));
    }
    __return_storage_ptr___00 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    anon_unknown_0::Stack::makeError
              (__return_storage_ptr___00,&local_210.stack,&local_3d8,(string *)local_470);
    __cxa_throw(__return_storage_ptr___00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  anon_unknown_0::Interpreter::runInvariants
            (&local_210,&local_3d8,(HeapObject *)local_210.scratch.v.h);
  local_380 = (_Rb_tree_node_base *)local_390;
  local_390 = (undefined1  [8])((ulong)local_390 & 0xffffffff00000000);
  local_388 = (_Base_ptr)0x0;
  local_370 = 0;
  local_378 = local_380;
  anon_unknown_0::Interpreter::objectFields
            ((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)local_470,(Interpreter *)this.h,(HeapObject *)0x1,SUB81(local_380,0));
  if (local_460._M_parent != (_Rb_tree_node_base *)(local_470 + 8)) {
    p_Var3 = local_460._M_parent;
    do {
      __k = *(key_type **)(p_Var3 + 1);
      ppIVar2 = std::
                map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                              *)local_398,__k);
      *ppIVar2 = (mapped_type)__k;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != (_Rb_tree_node_base *)(local_470 + 8));
  }
  local_420.h = this.h;
  std::
  _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               *)local_470);
  if (local_380 != (_Rb_tree_node_base *)local_390) {
    p_Var4 = local_380;
    do {
      ast_ = anon_unknown_0::Interpreter::objectIndex
                       (&local_210,&local_3d8,(HeapObject *)local_420.h,*(Identifier **)(p_Var4 + 2)
                        ,0);
      local_210.stack.stack.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].val.t = local_210.scratch.t;
      *(undefined4 *)
       &local_210.stack.stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].val.field_0x4 = local_210.scratch._4_4_;
      local_210.stack.stack.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].val.v = local_210.scratch.v;
      anon_unknown_0::Interpreter::evaluate
                (&local_210,ast_,
                 (int)((ulong)((long)local_210.stack.stack.
                                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_210.stack.stack.
                                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x3d70a3d7);
      if (string_output) {
        (anonymous_namespace)::Interpreter::manifestString_abi_cxx11_
                  ((UString *)local_470,(Interpreter *)&local_210,&ast_->location);
      }
      else {
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        local_440._M_string_length = 0;
        local_440.field_2._M_local_buf[0] = L'\0';
        anon_unknown_0::Interpreter::manifestJson
                  ((UString *)local_470,&local_210,&ast_->location,true,&local_440);
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,
                          CONCAT44(local_440.field_2._M_local_buf[1],
                                   local_440.field_2._M_local_buf[0]) * 4 + 4);
        }
      }
      local_210.scratch._0_8_ =
           *(undefined8 *)
            &local_210.stack.stack.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].val;
      local_210.scratch.v =
           local_210.stack.stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].val.v;
      if (local_210.stack.stack.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].kind == FRAME_CALL) {
        local_210.stack.calls = local_210.stack.calls - 1;
      }
      local_210.stack.stack.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_210.stack.stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      anon_unknown_0::Frame::~Frame
                (local_210.stack.stack.
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      encode_utf8(&local_3f8,(UString *)local_470);
      encode_utf8(&local_418,(UString *)(p_Var4 + 1));
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](__return_storage_ptr__,&local_418);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_node_base *)local_470._0_8_ != &local_460) {
        operator_delete((void *)local_470._0_8_,local_460._0_8_ * 4 + 4);
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Rb_tree_node_base *)local_390);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
               *)local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.file._M_dataplus._M_p != &local_3d8.file.field_2) {
    operator_delete(local_3d8.file._M_dataplus._M_p,local_3d8.file.field_2._M_allocated_capacity + 1
                   );
  }
  anon_unknown_0::Interpreter::~Interpreter(&local_210);
  return __return_storage_ptr__;
}

Assistant:

StrMap jsonnet_vm_execute_multi(Allocator *alloc, const AST *ast, const ExtMap &ext_vars,
                                unsigned max_stack, double gc_min_objects, double gc_growth_trigger,
                                const VmNativeCallbackMap &natives,
                                JsonnetImportCallback *import_callback, void *ctx,
                                bool string_output)
{
    Interpreter vm(alloc,
                   ext_vars,
                   max_stack,
                   gc_min_objects,
                   gc_growth_trigger,
                   natives,
                   import_callback,
                   ctx);
    vm.evaluate(ast, 0);
    return vm.manifestMulti(string_output);
}